

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O0

void accessPreviewImage(char *fileName)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  PreviewImage *this;
  char *in_RDI;
  PreviewRgba *pixel;
  int x;
  int y;
  PreviewImage *preview;
  RgbaInputFile file;
  uint local_68;
  uint local_64;
  RgbaInputFile local_48 [72];
  
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile(local_48,in_RDI,iVar2);
  Imf_3_4::RgbaInputFile::header();
  bVar1 = Imf_3_4::Header::hasPreviewImage();
  if ((bVar1 & 1) != 0) {
    Imf_3_4::RgbaInputFile::header();
    this = (PreviewImage *)Imf_3_4::Header::previewImage();
    for (local_64 = 0; uVar3 = Imf_3_4::PreviewImage::height(this), local_64 < uVar3;
        local_64 = local_64 + 1) {
      for (local_68 = 0; uVar3 = Imf_3_4::PreviewImage::width(this), local_68 < uVar3;
          local_68 = local_68 + 1) {
        Imf_3_4::PreviewImage::pixel(this,local_68,local_64);
      }
    }
  }
  Imf_3_4::RgbaInputFile::~RgbaInputFile(local_48);
  return;
}

Assistant:

void
accessPreviewImage (const char fileName[])
{
    // [begin accessPreviewImage]
    RgbaInputFile file (fileName);
        
    if (file.header().hasPreviewImage())
    {
        const PreviewImage &preview = file.header().previewImage();
        
        for (int y = 0; y < preview.height(); ++y)
        {
            for (int x = 0; x < preview.width(); ++x)
            {
        
                const PreviewRgba &pixel = preview.pixel (x, y);
        
                // ...
        
            }
        }
    }
    // [end accessPreviewImage]
}